

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  long *plVar10;
  ulong *puVar11;
  long lVar12;
  long *plVar13;
  ulong uVar14;
  long *plVar15;
  string expr;
  string decl;
  string lastelemexpr;
  string lo;
  string sd;
  string e [4] [7];
  string l [4];
  ostringstream os;
  long *local_ac8;
  long local_ac0;
  long local_ab8;
  long lStack_ab0;
  long *local_aa8;
  long local_aa0;
  long local_a98;
  long lStack_a90;
  ulong *local_a88;
  long local_a80;
  ulong local_a78;
  long lStack_a70;
  ulong *local_a68;
  long local_a60;
  ulong local_a58;
  long lStack_a50;
  ulong *local_a48;
  long local_a40;
  ulong local_a38;
  long lStack_a30;
  ulong *local_a28;
  long local_a20;
  ulong local_a18;
  long lStack_a10;
  ulong *local_a08;
  long local_a00;
  ulong local_9f8;
  long lStack_9f0;
  ulong *local_9e8;
  long local_9e0;
  ulong local_9d8;
  long lStack_9d0;
  long *local_9c8;
  long local_9c0;
  long local_9b8;
  long lStack_9b0;
  ulong *local_9a8;
  long local_9a0;
  ulong local_998;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  ulong *local_988;
  long local_980;
  ulong local_978;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  ulong *local_968;
  long local_960;
  ulong local_958;
  undefined4 uStack_950;
  undefined4 uStack_94c;
  ulong *local_948;
  long local_940;
  ulong local_938;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  ulong *local_928;
  long local_920;
  ulong local_918;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  long *local_908;
  undefined8 local_900;
  long local_8f8;
  undefined8 uStack_8f0;
  long *local_8e8;
  undefined8 local_8e0;
  long local_8d8;
  undefined8 uStack_8d0;
  long *local_8c8;
  undefined8 local_8c0;
  long local_8b8;
  undefined8 uStack_8b0;
  long *local_8a8;
  undefined8 local_8a0;
  long local_898;
  undefined8 uStack_890;
  long *local_888;
  undefined8 local_880;
  long local_878;
  undefined8 uStack_870;
  long *local_868;
  undefined8 local_860;
  long local_858;
  undefined8 uStack_850;
  long *local_848 [2];
  long local_838 [2];
  ulong *local_828;
  long local_820;
  ulong local_818;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  long *local_808 [2];
  long local_7f8 [2];
  long *local_7e8;
  long local_7e0;
  long local_7d8;
  long lStack_7d0;
  long *local_7c8;
  long local_7c0;
  long local_7b8;
  long lStack_7b0;
  long *local_7a8;
  long local_7a0;
  long local_798;
  long lStack_790;
  long *local_788;
  long local_780;
  long local_778;
  long lStack_770;
  long *local_768;
  long local_760;
  long local_758;
  long lStack_750;
  long *local_748;
  long local_740;
  long local_738;
  long lStack_730;
  long *local_728;
  long local_720;
  long local_718;
  long lStack_710;
  long *local_708;
  long local_700;
  long local_6f8;
  long lStack_6f0;
  long *local_6e8;
  long local_6e0;
  long local_6d8;
  long lStack_6d0;
  long *local_6c8;
  long local_6c0;
  long local_6b8;
  long lStack_6b0;
  long *local_6a8;
  long local_6a0;
  long local_698;
  long lStack_690;
  long *local_688;
  long local_680;
  long local_678 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  long *local_248 [2];
  long local_238 [2];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"bvec3","");
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"vec4","");
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"ivec3","");
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"ivec3","");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"uvec2","");
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"vec2","");
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"uvec4","");
  local_4c8[0] = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"mat2","");
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"mat3","");
  local_488[0] = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"mat4","");
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"mat4","");
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"mat2x3","");
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"mat3x2","");
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"mat4x2","");
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"mat2","");
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"mat3","");
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"mat4","");
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"mat4","");
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"mat2x3","");
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"mat3x2","");
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"mat4x2","");
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"S0","");
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"S1","");
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"S2","");
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"S2","");
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"S4","");
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"S5","");
  plVar13 = local_238;
  local_248[0] = plVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"S6","");
  local_688 = local_678;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_688,
             "\nstruct S0 {\n  float f;\n  int i;\n  uint ui;\n  bool b;\n};\nstruct S1 {\n  ivec3 iv;\n  bvec2 bv;\n  vec4 v;\n  uvec2 uv;\n};\nstruct S2 {\n  mat2x2 m22;\n  mat4x4 m44;\n  mat2x3 m23;\n  mat4x2 m42;\n  mat3x4 m34;\n};\nstruct S4 {\n  float f[1];\n  int i[2];\n  uint ui[3];\n  bool b[4];\n  ivec3 iv[5];\n  bvec2 bv[6];\n  vec4  v[7];\n  uvec2 uv[8];\n};\nstruct S5 {\n  S0 s0;\n  S1 s1;\n  S2 s2;\n};\nstruct S6 {\n  S4 s4[3];\n};"
             ,"");
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,0x1b32ab9);
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"std140","");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"std430","");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"shared","");
  plVar15 = local_1b8;
  local_1c8[0] = plVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"packed","");
  std::__cxx11::string::_M_append
            ((char *)local_808,(ulong)local_228[(long)*(int *)((long)this + 0x58) * 4]);
  if (*(int *)((long)this + 0x54) == 2) {
    std::__cxx11::string::append((char *)local_808);
  }
  local_848[0] = local_838;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_848,local_688,local_680 + (long)local_688);
  std::__cxx11::string::append((char *)local_848);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_848,(ulong)local_808[0]);
  local_7e8 = &local_7d8;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_7d8 = *plVar10;
    lStack_7d0 = plVar7[3];
  }
  else {
    local_7d8 = *plVar10;
    local_7e8 = (long *)*plVar7;
  }
  local_7e0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_7e8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_998 = *puVar11;
    uStack_990 = (undefined4)plVar7[3];
    uStack_98c = *(undefined4 *)((long)plVar7 + 0x1c);
    local_9a8 = &local_998;
  }
  else {
    local_998 = *puVar11;
    local_9a8 = (ulong *)*plVar7;
  }
  local_9a0 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar1 = *(char *)((long)this + 0x5c);
  if (cVar1 == '\x01') {
    std::operator+(&local_5c8,"\n  ",&local_5a8 + (long)*(int *)((long)this + 0x54) * 7);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_5c8);
    local_9e8 = &local_9d8;
    puVar11 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar11) {
      local_9d8 = *puVar11;
      lStack_9d0 = plVar7[3];
    }
    else {
      local_9d8 = *puVar11;
      local_9e8 = (ulong *)*plVar7;
    }
    local_9e0 = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
  }
  else {
    local_9e8 = &local_9d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,0x1b32ab9);
  }
  uVar14 = 0xf;
  if (local_9a8 != &local_998) {
    uVar14 = local_998;
  }
  if (uVar14 < (ulong)(local_9e0 + local_9a0)) {
    uVar14 = 0xf;
    if (local_9e8 != &local_9d8) {
      uVar14 = local_9d8;
    }
    if (uVar14 < (ulong)(local_9e0 + local_9a0)) goto LAB_00970d89;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9e8,0,(char *)0x0,(ulong)local_9a8);
  }
  else {
LAB_00970d89:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9a8,(ulong)local_9e8);
  }
  local_908 = &local_8f8;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_8f8 = *plVar7;
    uStack_8f0 = puVar8[3];
  }
  else {
    local_8f8 = *plVar7;
    local_908 = (long *)*puVar8;
  }
  local_900 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_908);
  local_7c8 = &local_7b8;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_7b8 = *plVar10;
    lStack_7b0 = plVar7[3];
  }
  else {
    local_7b8 = *plVar10;
    local_7c8 = (long *)*plVar7;
  }
  local_7c0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_7c8,
                              (ulong)(&local_5a8)[(long)*(int *)((long)this + 0x54) * 7]._M_dataplus
                                     ._M_p);
  local_7a8 = &local_798;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_798 = *plVar10;
    lStack_790 = plVar7[3];
  }
  else {
    local_798 = *plVar10;
    local_7a8 = (long *)*plVar7;
  }
  local_7a0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_7a8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_978 = *puVar11;
    uStack_970 = (undefined4)plVar7[3];
    uStack_96c = *(undefined4 *)((long)plVar7 + 0x1c);
    local_988 = &local_978;
  }
  else {
    local_978 = *puVar11;
    local_988 = (ulong *)*plVar7;
  }
  local_980 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar2 = *(char *)((long)this + 0x5c);
  if (cVar2 == '\x01') {
    std::operator+(&local_5e8,"\n  ",&local_588 + (long)*(int *)((long)this + 0x54) * 7);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_5e8);
    local_a08 = &local_9f8;
    puVar11 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar11) {
      local_9f8 = *puVar11;
      lStack_9f0 = plVar7[3];
    }
    else {
      local_9f8 = *puVar11;
      local_a08 = (ulong *)*plVar7;
    }
    local_a00 = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
  }
  else {
    local_a08 = &local_9f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a08,0x1b32ab9);
  }
  uVar14 = 0xf;
  if (local_988 != &local_978) {
    uVar14 = local_978;
  }
  if (uVar14 < (ulong)(local_a00 + local_980)) {
    uVar14 = 0xf;
    if (local_a08 != &local_9f8) {
      uVar14 = local_9f8;
    }
    if (uVar14 < (ulong)(local_a00 + local_980)) goto LAB_00971052;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a08,0,(char *)0x0,(ulong)local_988);
  }
  else {
LAB_00971052:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_988,(ulong)local_a08);
  }
  local_8e8 = &local_8d8;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_8d8 = *plVar7;
    uStack_8d0 = puVar8[3];
  }
  else {
    local_8d8 = *plVar7;
    local_8e8 = (long *)*puVar8;
  }
  local_8e0 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_8e8);
  local_788 = &local_778;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_778 = *plVar10;
    lStack_770 = plVar7[3];
  }
  else {
    local_778 = *plVar10;
    local_788 = (long *)*plVar7;
  }
  local_780 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_788,
                              (ulong)(&local_588)[(long)*(int *)((long)this + 0x54) * 7]._M_dataplus
                                     ._M_p);
  local_768 = &local_758;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_758 = *plVar10;
    lStack_750 = plVar7[3];
  }
  else {
    local_758 = *plVar10;
    local_768 = (long *)*plVar7;
  }
  local_760 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_768);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_958 = *puVar11;
    uStack_950 = (undefined4)plVar7[3];
    uStack_94c = *(undefined4 *)((long)plVar7 + 0x1c);
    local_968 = &local_958;
  }
  else {
    local_958 = *puVar11;
    local_968 = (ulong *)*plVar7;
  }
  local_960 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar3 = *(char *)((long)this + 0x5c);
  if (cVar3 == '\x01') {
    std::operator+(&local_608,"\n  ",&local_568 + (long)*(int *)((long)this + 0x54) * 7);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_608);
    local_a28 = &local_a18;
    puVar11 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar11) {
      local_a18 = *puVar11;
      lStack_a10 = plVar7[3];
    }
    else {
      local_a18 = *puVar11;
      local_a28 = (ulong *)*plVar7;
    }
    local_a20 = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
  }
  else {
    local_a28 = &local_a18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a28,0x1b32ab9);
  }
  uVar14 = 0xf;
  if (local_968 != &local_958) {
    uVar14 = local_958;
  }
  if (uVar14 < (ulong)(local_a20 + local_960)) {
    uVar14 = 0xf;
    if (local_a28 != &local_a18) {
      uVar14 = local_a18;
    }
    if (uVar14 < (ulong)(local_a20 + local_960)) goto LAB_0097131b;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a28,0,(char *)0x0,(ulong)local_968);
  }
  else {
LAB_0097131b:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_968,(ulong)local_a28);
  }
  local_8c8 = &local_8b8;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_8b8 = *plVar7;
    uStack_8b0 = puVar8[3];
  }
  else {
    local_8b8 = *plVar7;
    local_8c8 = (long *)*puVar8;
  }
  local_8c0 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_8c8);
  local_748 = &local_738;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_738 = *plVar10;
    lStack_730 = plVar7[3];
  }
  else {
    local_738 = *plVar10;
    local_748 = (long *)*plVar7;
  }
  local_740 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_748,
                              (ulong)(&local_568)[(long)*(int *)((long)this + 0x54) * 7]._M_dataplus
                                     ._M_p);
  local_728 = &local_718;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_718 = *plVar10;
    lStack_710 = plVar7[3];
  }
  else {
    local_718 = *plVar10;
    local_728 = (long *)*plVar7;
  }
  local_720 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_728);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_938 = *puVar11;
    uStack_930 = (undefined4)plVar7[3];
    uStack_92c = *(undefined4 *)((long)plVar7 + 0x1c);
    local_948 = &local_938;
  }
  else {
    local_938 = *puVar11;
    local_948 = (ulong *)*plVar7;
  }
  local_940 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar4 = *(char *)((long)this + 0x5c);
  if (cVar4 == '\x01') {
    std::operator+(&local_628,"\n  ",&local_528 + (long)*(int *)((long)this + 0x54) * 7);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_628);
    local_a48 = &local_a38;
    puVar11 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar11) {
      local_a38 = *puVar11;
      lStack_a30 = plVar7[3];
    }
    else {
      local_a38 = *puVar11;
      local_a48 = (ulong *)*plVar7;
    }
    local_a40 = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
  }
  else {
    local_a48 = &local_a38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a48,0x1b32ab9);
  }
  uVar14 = 0xf;
  if (local_948 != &local_938) {
    uVar14 = local_938;
  }
  if (uVar14 < (ulong)(local_a40 + local_940)) {
    uVar14 = 0xf;
    if (local_a48 != &local_a38) {
      uVar14 = local_a38;
    }
    if (uVar14 < (ulong)(local_a40 + local_940)) goto LAB_009715e4;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a48,0,(char *)0x0,(ulong)local_948);
  }
  else {
LAB_009715e4:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_948,(ulong)local_a48);
  }
  local_8a8 = &local_898;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_898 = *plVar7;
    uStack_890 = puVar8[3];
  }
  else {
    local_898 = *plVar7;
    local_8a8 = (long *)*puVar8;
  }
  local_8a0 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_8a8);
  local_708 = &local_6f8;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_6f8 = *plVar10;
    lStack_6f0 = plVar7[3];
  }
  else {
    local_6f8 = *plVar10;
    local_708 = (long *)*plVar7;
  }
  local_700 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_708,
                              (ulong)(&local_528)[(long)*(int *)((long)this + 0x54) * 7]._M_dataplus
                                     ._M_p);
  local_6e8 = &local_6d8;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_6d8 = *plVar10;
    lStack_6d0 = plVar7[3];
  }
  else {
    local_6d8 = *plVar10;
    local_6e8 = (long *)*plVar7;
  }
  local_6e0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_6e8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_918 = *puVar11;
    uStack_910 = (undefined4)plVar7[3];
    uStack_90c = *(undefined4 *)((long)plVar7 + 0x1c);
    local_928 = &local_918;
  }
  else {
    local_918 = *puVar11;
    local_928 = (ulong *)*plVar7;
  }
  local_920 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar5 = *(char *)((long)this + 0x5c);
  if (cVar5 == '\x01') {
    std::operator+(&local_648,"\n  ",&local_508 + (long)*(int *)((long)this + 0x54) * 7);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_648);
    local_a68 = &local_a58;
    puVar11 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar11) {
      local_a58 = *puVar11;
      lStack_a50 = plVar7[3];
    }
    else {
      local_a58 = *puVar11;
      local_a68 = (ulong *)*plVar7;
    }
    local_a60 = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
  }
  else {
    local_a68 = &local_a58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a68,0x1b32ab9);
  }
  uVar14 = 0xf;
  if (local_928 != &local_918) {
    uVar14 = local_918;
  }
  if (uVar14 < (ulong)(local_a60 + local_920)) {
    uVar14 = 0xf;
    if (local_a68 != &local_a58) {
      uVar14 = local_a58;
    }
    if (uVar14 < (ulong)(local_a60 + local_920)) goto LAB_009718ae;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a68,0,(char *)0x0,(ulong)local_928);
  }
  else {
LAB_009718ae:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_928,(ulong)local_a68);
  }
  local_888 = &local_878;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_878 = *plVar7;
    uStack_870 = puVar8[3];
  }
  else {
    local_878 = *plVar7;
    local_888 = (long *)*puVar8;
  }
  local_880 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_888);
  local_6c8 = &local_6b8;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_6b8 = *plVar10;
    lStack_6b0 = plVar7[3];
  }
  else {
    local_6b8 = *plVar10;
    local_6c8 = (long *)*plVar7;
  }
  local_6c0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_6c8,
                              (ulong)(&local_508)[(long)*(int *)((long)this + 0x54) * 7]._M_dataplus
                                     ._M_p);
  local_6a8 = &local_698;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_698 = *plVar10;
    lStack_690 = plVar7[3];
  }
  else {
    local_698 = *plVar10;
    local_6a8 = (long *)*plVar7;
  }
  local_6a0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_6a8);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_818 = *puVar11;
    uStack_810 = (undefined4)plVar7[3];
    uStack_80c = *(undefined4 *)((long)plVar7 + 0x1c);
    local_828 = &local_818;
  }
  else {
    local_818 = *puVar11;
    local_828 = (ulong *)*plVar7;
  }
  local_820 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar6 = *(char *)((long)this + 0x5c);
  if (cVar6 == '\x01') {
    std::operator+(&local_668,"\n  ",&local_4e8 + (long)*(int *)((long)this + 0x54) * 7);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_668);
    local_a88 = &local_a78;
    puVar11 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar11) {
      local_a78 = *puVar11;
      lStack_a70 = plVar7[3];
    }
    else {
      local_a78 = *puVar11;
      local_a88 = (ulong *)*plVar7;
    }
    local_a80 = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
  }
  else {
    local_a88 = &local_a78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,0x1b32ab9);
  }
  uVar14 = 0xf;
  if (local_828 != &local_818) {
    uVar14 = local_818;
  }
  if (uVar14 < (ulong)(local_a80 + local_820)) {
    uVar14 = 0xf;
    if (local_a88 != &local_a78) {
      uVar14 = local_a78;
    }
    if ((ulong)(local_a80 + local_820) <= uVar14) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a88,0,(char *)0x0,(ulong)local_828);
      goto LAB_00971b7f;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_828,(ulong)local_a88);
LAB_00971b7f:
  local_868 = &local_858;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_858 = *plVar7;
    uStack_850 = puVar8[3];
  }
  else {
    local_858 = *plVar7;
    local_868 = (long *)*puVar8;
  }
  local_860 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_868);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_9b8 = *plVar10;
    lStack_9b0 = plVar7[3];
    local_9c8 = &local_9b8;
  }
  else {
    local_9b8 = *plVar10;
    local_9c8 = (long *)*plVar7;
  }
  local_9c0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_9c8,
                              (ulong)(&local_4e8)[(long)*(int *)((long)this + 0x54) * 7]._M_dataplus
                                     ._M_p);
  local_ac8 = &local_ab8;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_ab8 = *plVar10;
    lStack_ab0 = plVar7[3];
  }
  else {
    local_ab8 = *plVar10;
    local_ac8 = (long *)*plVar7;
  }
  local_ac0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_ac8);
  local_aa8 = &local_a98;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_a98 = *plVar10;
    lStack_a90 = plVar7[3];
  }
  else {
    local_a98 = *plVar10;
    local_aa8 = (long *)*plVar7;
  }
  local_aa0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_ac8 != &local_ab8) {
    operator_delete(local_ac8,local_ab8 + 1);
  }
  if (local_9c8 != &local_9b8) {
    operator_delete(local_9c8,local_9b8 + 1);
  }
  if (local_868 != &local_858) {
    operator_delete(local_868,local_858 + 1);
  }
  if (local_a88 != &local_a78) {
    operator_delete(local_a88,local_a78 + 1);
  }
  if ((cVar6 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2)) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  if (local_828 != &local_818) {
    operator_delete(local_828,local_818 + 1);
  }
  if (local_6a8 != &local_698) {
    operator_delete(local_6a8,local_698 + 1);
  }
  if (local_6c8 != &local_6b8) {
    operator_delete(local_6c8,local_6b8 + 1);
  }
  if (local_888 != &local_878) {
    operator_delete(local_888,local_878 + 1);
  }
  if (local_a68 != &local_a58) {
    operator_delete(local_a68,local_a58 + 1);
  }
  if ((cVar5 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2)) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  if (local_928 != &local_918) {
    operator_delete(local_928,local_918 + 1);
  }
  if (local_6e8 != &local_6d8) {
    operator_delete(local_6e8,local_6d8 + 1);
  }
  if (local_708 != &local_6f8) {
    operator_delete(local_708,local_6f8 + 1);
  }
  if (local_8a8 != &local_898) {
    operator_delete(local_8a8,local_898 + 1);
  }
  if (local_a48 != &local_a38) {
    operator_delete(local_a48,local_a38 + 1);
  }
  if ((cVar4 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2)) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if (local_948 != &local_938) {
    operator_delete(local_948,local_938 + 1);
  }
  if (local_728 != &local_718) {
    operator_delete(local_728,local_718 + 1);
  }
  if (local_748 != &local_738) {
    operator_delete(local_748,local_738 + 1);
  }
  if (local_8c8 != &local_8b8) {
    operator_delete(local_8c8,local_8b8 + 1);
  }
  if (local_a28 != &local_a18) {
    operator_delete(local_a28,local_a18 + 1);
  }
  if ((cVar3 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2)) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if (local_968 != &local_958) {
    operator_delete(local_968,local_958 + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,local_758 + 1);
  }
  if (local_788 != &local_778) {
    operator_delete(local_788,local_778 + 1);
  }
  if (local_8e8 != &local_8d8) {
    operator_delete(local_8e8,local_8d8 + 1);
  }
  if (local_a08 != &local_9f8) {
    operator_delete(local_a08,local_9f8 + 1);
  }
  if ((cVar2 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2)) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if (local_988 != &local_978) {
    operator_delete(local_988,local_978 + 1);
  }
  if (local_7a8 != &local_798) {
    operator_delete(local_7a8,local_798 + 1);
  }
  if (local_7c8 != &local_7b8) {
    operator_delete(local_7c8,local_7b8 + 1);
  }
  if (local_908 != &local_8f8) {
    operator_delete(local_908,local_8f8 + 1);
  }
  if (local_9e8 != &local_9d8) {
    operator_delete(local_9e8,local_9d8 + 1);
  }
  if ((cVar1 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2)) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if (local_9a8 != &local_998) {
    operator_delete(local_9a8,local_998 + 1);
  }
  if (local_7e8 != &local_7d8) {
    operator_delete(local_7e8,local_7d8 + 1);
  }
  if (local_848[0] != local_838) {
    operator_delete(local_848[0],local_838[0] + 1);
  }
  local_ac8 = &local_ab8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ac8,
             "\n  g_length[0] = g_input0.length();\n  g_length[1] = g_input1.data.length();\n  g_length[2] = g_input23[0].data.length();\n  g_length[3] = g_input23[1].data.length();\n  g_length[4] = g_output0.data.length();\n  g_length[5] = g_input4.data.length();\n  g_length[6] = g_output1.data.length();"
             ,"");
  local_9c8 = &local_9b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9c8,
             "\n  g_output0.data[g_output0.data.length()-2] += g_output0.data[g_output0.data.length()-1];\n  g_output1.data[g_output1.data.length()-2] += g_output1.data[g_output1.data.length()-1];"
             ,"");
  if (*(char *)((long)this + 100) == '\x01') {
    std::__cxx11::string::_M_append((char *)&local_ac8,(ulong)local_9c8);
  }
  if (*(int *)((long)this + 0x50) == 0) {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_aa8,local_aa0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nvoid main() {\n  gl_Position = vec4(0,0,0,1);",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_ac8,local_ac0);
  }
  if (*(int *)((long)this + 0x50) == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nlayout(location = 0) out vec4 o_color;",0x27);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_aa8,local_aa0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);",0x34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_ac8,local_ac0);
  }
  if (*(int *)((long)this + 0x50) == 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nlayout(local_size_x = 1) in;",0x1d);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_aa8,local_aa0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nvoid main() {",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_ac8,local_ac0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n}",2);
  std::__cxx11::stringbuf::str();
  if (local_9c8 != &local_9b8) {
    operator_delete(local_9c8,local_9b8 + 1);
  }
  if (local_ac8 != &local_ab8) {
    operator_delete(local_ac8,local_ab8 + 1);
  }
  if (local_aa8 != &local_a98) {
    operator_delete(local_aa8,local_a98 + 1);
  }
  lVar12 = -0x80;
  do {
    if (plVar15 != (long *)plVar15[-2]) {
      operator_delete((long *)plVar15[-2],*plVar15 + 1);
    }
    plVar15 = plVar15 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  if (local_808[0] != local_7f8) {
    operator_delete(local_808[0],local_7f8[0] + 1);
  }
  if (local_688 != local_678) {
    operator_delete(local_688,local_678[0] + 1);
  }
  lVar12 = -0x380;
  do {
    if (plVar13 != (long *)plVar13[-2]) {
      operator_delete((long *)plVar13[-2],*plVar13 + 1);
    }
    plVar13 = plVar13 + -4;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string BuildShader()
	{
		std::ostringstream os;
		std::string		   e[4][7] = { { "bvec3", "vec4", "ivec3", "ivec3", "uvec2", "vec2", "uvec4" },
								{ "mat2", "mat3", "mat4", "mat4", "mat2x3", "mat3x2", "mat4x2" },
								{ "mat2", "mat3", "mat4", "mat4", "mat2x3", "mat3x2", "mat4x2" },
								{ "S0", "S1", "S2", "S2", "S4", "S5", "S6" } };

		std::string sd =
			NL "struct S0 {" NL "  float f;" NL "  int i;" NL "  uint ui;" NL "  bool b;" NL "};" NL "struct S1 {" NL
			   "  ivec3 iv;" NL "  bvec2 bv;" NL "  vec4 v;" NL "  uvec2 uv;" NL "};" NL "struct S2 {" NL
			   "  mat2x2 m22;" NL "  mat4x4 m44;" NL "  mat2x3 m23;" NL "  mat4x2 m42;" NL "  mat3x4 m34;" NL "};" NL
			   "struct S4 {" NL "  float f[1];" NL "  int i[2];" NL "  uint ui[3];" NL "  bool b[4];" NL
			   "  ivec3 iv[5];" NL "  bvec2 bv[6];" NL "  vec4  v[7];" NL "  uvec2 uv[8];" NL "};" NL "struct S5 {" NL
			   "  S0 s0;" NL "  S1 s1;" NL "  S2 s2;" NL "};" NL "struct S6 {" NL "  S4 s4[3];" NL "};";

		std::string lo   = "";
		std::string l[4] = { "std140", "std430", "shared", "packed" };
		lo += l[layout];

		if (etype == matrix_rm)
			lo += ", row_major";

		std::string decl = sd + NL "layout(" + lo + ") buffer;" NL "layout(binding = 0) readonly buffer Input0 {" +
						   ((other_members) ? ("\n  " + e[etype][0] + " pad0;") : "") + NL "  " + e[etype][0] +
						   " g_input0[];" NL "};" NL "layout(binding = 1) readonly buffer Input1 {" +
						   ((other_members) ? ("\n  " + e[etype][1] + " pad1;") : "") + NL "  " + e[etype][1] +
						   " data[];" NL "} g_input1;" NL "layout(binding = 2) readonly buffer Input23 {" +
						   ((other_members) ? ("\n  " + e[etype][2] + " pad2;") : "") + NL "  " + e[etype][2] +
						   " data[];" NL "} g_input23[2];" NL "layout(binding = 4) buffer Output0 {" +
						   ((other_members) ? ("\n  " + e[etype][4] + " pad4;") : "") + NL "  " + e[etype][4] +
						   " data[];" NL "} g_output0;" NL "layout(binding = 5) readonly buffer Input4 {" +
						   ((other_members) ? ("\n  " + e[etype][5] + " pad5;") : "") + NL "  " + e[etype][5] +
						   " data[];" NL "} g_input4;" NL "layout(binding = 6) buffer Output1 {" +
						   ((other_members) ? ("\n  " + e[etype][6] + " pad6;") : "") + NL "  " + e[etype][6] +
						   " data[];" NL "} g_output1;" NL "layout(std430, binding = 7) buffer Output {" NL
						   "  int g_length[];" NL "};";

		std::string expr =
			NL "  g_length[0] = g_input0.length();" NL "  g_length[1] = g_input1.data.length();" NL
			   "  g_length[2] = g_input23[0].data.length();" NL "  g_length[3] = g_input23[1].data.length();" NL
			   "  g_length[4] = g_output0.data.length();" NL "  g_length[5] = g_input4.data.length();" NL
			   "  g_length[6] = g_output1.data.length();";

		std::string lastelemexpr =
			NL "  g_output0.data[g_output0.data.length()-2] += g_output0.data[g_output0.data.length()-1];" NL
			   "  g_output1.data[g_output1.data.length()-2] += g_output1.data[g_output1.data.length()-1];";

		if (length_as_index)
			expr += lastelemexpr;
		if (stage == vertex)
		{
			os << decl << NL "void main() {" NL "  gl_Position = vec4(0,0,0,1);" << expr;
		}
		if (stage == fragment)
		{
			os << NL "layout(location = 0) out vec4 o_color;" << decl
			   << NL "void main() {" NL "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" << expr;
		}
		if (stage == compute)
		{
			os << NL "layout(local_size_x = 1) in;" << decl << NL "void main() {" << expr;
		}
		os << NL "}";
		return os.str();
	}